

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

Json * Json::parseFile(Json *__return_storage_ptr__,string *path_to_file)

{
  size_type __n;
  long lVar1;
  allocator<char> local_299;
  undefined1 local_298 [8];
  string data;
  uintmax_t size;
  ifstream local_260 [8];
  ifstream f;
  undefined1 local_58 [8];
  path path;
  string *path_to_file_local;
  
  path._56_8_ = path_to_file;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)local_58,path_to_file);
  std::ifstream::
  ifstream<std::experimental::filesystem::v1::__cxx11::path,std::experimental::filesystem::v1::__cxx11::path>
            (local_260,(path *)local_58,_S_in);
  __n = std::experimental::filesystem::v1::file_size((path *)local_58);
  data.field_2._8_8_ = __n;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_298,__n,' ',&local_299);
  std::allocator<char>::~allocator(&local_299);
  lVar1 = std::__cxx11::string::data();
  std::istream::read((char *)local_260,lVar1);
  Json(__return_storage_ptr__,(string *)local_298);
  std::__cxx11::string::~string((string *)local_298);
  std::ifstream::~ifstream(local_260);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Json Json::parseFile(const std::string& path_to_file) {
    std::experimental::filesystem::path path(path_to_file);
    std::ifstream f(path);
    const auto size = std::experimental::filesystem::file_size(path);
    std::string data(size, ' ');
    f.read(data.data(), size);
    return Json(data);
}